

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

void prvTidyFreeAttrTable(TidyDocImpl *doc)

{
  TidyDocImpl *doc_local;
  
  attrsEmptyHash(doc,&doc->attribs);
  prvTidyFreeAnchors(doc);
  FreeDeclaredAttributes(doc);
  return;
}

Assistant:

void TY_(FreeAttrTable)( TidyDocImpl* doc )
{
    attrsEmptyHash( doc, &doc->attribs );
    TY_(FreeAnchors)( doc );
    FreeDeclaredAttributes( doc );
}